

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSim.c
# Opt level: O0

void Ssc_GiaPrintPiPatterns(Gia_Man_t *p)

{
  int iVar1;
  bool bVar2;
  int local_24;
  int i;
  word *pSimAig;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar2 = false;
    if (local_24 < iVar1) {
      pSimAig = (word *)Gia_ManCi(p,local_24);
      bVar2 = (Gia_Obj_t *)pSimAig != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    Gia_ObjSimObj(p,(Gia_Obj_t *)pSimAig);
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void Ssc_GiaPrintPiPatterns( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    word * pSimAig;
    int i;//, nWords = Gia_ObjSimWords( p );
    Gia_ManForEachCi( p, pObj, i )
    {
        pSimAig = Gia_ObjSimObj( p, pObj );
//        Extra_PrintBinary( stdout, pSimAig, 64 * nWords );
    }
}